

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O3

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,ContextLut literal_context_lut,BrotliEncoderParams *params,
                 int *dist_cache,Hasher *hasher,ZopfliNode *nodes)

{
  ulong max_backward_limit;
  uint32_t *puVar1;
  HasherCommon *pHVar2;
  undefined1 auVar3 [16];
  int iVar4;
  size_t pos;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  BackwardMatch *pBVar9;
  size_t sVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint8_t *puVar15;
  ulong uVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  uint8_t *puVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ZopfliNode *nodes_00;
  BackwardMatch *local_19d0;
  ulong local_19c8;
  ulong local_19c0;
  ulong local_19a0;
  long local_1980;
  long local_1960;
  undefined8 local_1908;
  size_t local_1900;
  uint32_t local_18f8 [38];
  StartPosQueue queue;
  BackwardMatch matches [384];
  ZopfliCostModel local_b58;
  
  iVar4 = params->lgwin;
  uVar11 = 0x145;
  if (params->quality < 0xb) {
    uVar11 = 0x96;
  }
  lVar21 = 0;
  if (0x7e < num_bytes) {
    lVar21 = num_bytes - 0x7f;
  }
  sVar10 = params->stream_offset;
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,&local_b58,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(&local_b58,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  if (3 < num_bytes) {
    max_backward_limit = (1L << ((byte)iVar4 & 0x3f)) - 0x10;
    local_1900 = position + sVar10;
    pos = 0;
    do {
      auVar3 = _DAT_0013b170;
      uVar19 = pos + position;
      uVar14 = max_backward_limit;
      if (uVar19 < max_backward_limit) {
        uVar14 = uVar19;
      }
      local_1908 = sVar10 + uVar19;
      if (max_backward_limit <= local_1908) {
        local_1908 = max_backward_limit;
      }
      uVar16 = num_bytes - pos;
      uVar5 = uVar19 & ringbuffer_mask;
      uVar6 = 0x10;
      if (params->quality == 0xb) {
        uVar6 = 0x40;
      }
      uVar29 = 0;
      if (uVar6 <= uVar19) {
        uVar29 = uVar19 - uVar6;
      }
      uVar6 = (pos - 1) + position;
      uVar28 = 1;
      local_19d0 = matches;
      if (uVar29 < uVar6) {
        puVar15 = ringbuffer + uVar5;
        uVar13 = (ulong)((uint)uVar16 & 7);
        local_19d0 = matches;
        while (uVar19 - uVar6 <= uVar14) {
          uVar25 = uVar6 & ringbuffer_mask;
          if ((*puVar15 == ringbuffer[uVar25]) && (puVar15[1] == ringbuffer[uVar25 + 1])) {
            if (7 < uVar16) {
              lVar26 = 0;
              uVar22 = 0;
LAB_001129bb:
              if (*(ulong *)(puVar15 + uVar22 * 8) == *(ulong *)(ringbuffer + uVar22 * 8 + uVar25))
              goto code_r0x001129c8;
              uVar22 = *(ulong *)(ringbuffer + uVar22 * 8 + uVar25) ^
                       *(ulong *)(puVar15 + uVar22 * 8);
              uVar25 = 0;
              if (uVar22 != 0) {
                for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                }
              }
              uVar22 = (uVar25 >> 3 & 0x1fffffff) - lVar26;
              goto LAB_001129fb;
            }
            uVar17 = 0;
            puVar27 = puVar15;
LAB_00112a40:
            uVar22 = uVar17;
            if (uVar13 != 0) {
              uVar7 = uVar13 | uVar17;
              uVar23 = uVar13;
              do {
                uVar22 = uVar17;
                if (ringbuffer[uVar17 + uVar25] != *puVar27) break;
                puVar27 = puVar27 + 1;
                uVar17 = uVar17 + 1;
                uVar23 = uVar23 - 1;
                uVar22 = uVar7;
              } while (uVar23 != 0);
            }
LAB_001129fb:
            if (uVar28 < uVar22) {
              local_19d0->distance = (uint32_t)(uVar19 - uVar6);
              local_19d0->length_and_code = (int)uVar22 << 5;
              local_19d0 = local_19d0 + 1;
              uVar28 = uVar22;
            }
          }
          uVar6 = uVar6 - 1;
          if ((uVar6 <= uVar29) || (2 < uVar28)) break;
        }
      }
      if (uVar28 < uVar16) {
        uVar12 = (uint)(*(int *)(ringbuffer + uVar5) * 0x1e35a7bd) >> 0xf;
        uVar6 = (hasher->privat)._H5.bucket_size_;
        puVar1 = (hasher->privat)._H2.buckets_;
        pHVar2 = (hasher->privat)._H40.common;
        uVar13 = (ulong)puVar1[uVar12];
        uVar29 = uVar16;
        if (0x7f < uVar16) {
          puVar1[uVar12] = (uint32_t)uVar19;
          uVar29 = 0x80;
        }
        local_1980 = (uVar6 & uVar19) * 2 + 1;
        local_1960 = (uVar6 & uVar19) * 2;
        if (uVar19 != uVar13) {
          lVar26 = 0x40;
          local_19a0 = 0;
          uVar25 = 0;
LAB_00112dd5:
          bVar30 = lVar26 != 0;
          lVar26 = lVar26 + -1;
          if ((uVar19 - uVar13 <= uVar14) && (bVar30)) {
            uVar22 = local_19a0;
            if (uVar25 < local_19a0) {
              uVar22 = uVar25;
            }
            puVar15 = ringbuffer + uVar22 + (uVar13 & ringbuffer_mask);
            uVar17 = uVar16 - uVar22;
            if (7 < uVar17) {
              uVar7 = uVar17 & 0xfffffffffffffff8;
              lVar24 = 0;
              uVar23 = 0;
LAB_00112e40:
              if (*(ulong *)(puVar15 + uVar23 * 8) ==
                  *(ulong *)(ringbuffer + uVar23 * 8 + uVar22 + uVar5)) goto code_r0x00112e4d;
              uVar23 = *(ulong *)(ringbuffer + uVar23 * 8 + uVar22 + uVar5) ^
                       *(ulong *)(puVar15 + uVar23 * 8);
              uVar17 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                }
              }
              uVar23 = (uVar17 >> 3 & 0x1fffffff) - lVar24;
              goto LAB_00112e87;
            }
            uVar7 = 0;
            goto LAB_00112f5d;
          }
        }
LAB_00112aea:
        if (0x7f < uVar16) {
          iVar4 = (hasher->privat)._H5.hash_shift_;
          *(int *)((long)&pHVar2->extra + local_1960 * 4) = iVar4;
LAB_00112b06:
          *(int *)((long)&pHVar2->extra + local_1980 * 4) = iVar4;
        }
      }
LAB_00112b0e:
      lVar26 = 3;
      auVar31 = _DAT_0013b0d0;
      auVar32 = _DAT_0013b160;
      do {
        auVar33 = auVar31 ^ auVar3;
        if (auVar33._4_4_ == -0x80000000 && auVar33._0_4_ < -0x7fffffda) {
          *(undefined4 *)((long)&local_1908 + lVar26 * 4 + 4) = 0xfffffff;
          local_18f8[lVar26 + -2] = 0xfffffff;
        }
        auVar33 = auVar32 ^ auVar3;
        if (auVar33._4_4_ == -0x80000000 && auVar33._0_4_ < -0x7fffffda) {
          local_18f8[lVar26 + -1] = 0xfffffff;
          local_18f8[lVar26] = 0xfffffff;
        }
        lVar24 = auVar31._8_8_;
        auVar31._0_8_ = auVar31._0_8_ + 4;
        auVar31._8_8_ = lVar24 + 4;
        lVar24 = auVar32._8_8_;
        auVar32._0_8_ = auVar32._0_8_ + 4;
        auVar32._8_8_ = lVar24 + 4;
        lVar26 = lVar26 + 4;
      } while (lVar26 != 0x2b);
      uVar28 = uVar28 + 1;
      if (uVar28 < 5) {
        uVar28 = 4;
      }
      nodes_00 = (ZopfliNode *)0x112bf9;
      iVar4 = BrotliFindAllStaticDictionaryMatches
                        (&params->dictionary,ringbuffer + uVar5,uVar28,uVar16,local_18f8);
      if (iVar4 != 0) {
        if (0x24 < uVar16) {
          uVar16 = 0x25;
        }
        if (uVar28 <= uVar16) {
          iVar4 = (int)uVar28 << 5;
          do {
            uVar12 = local_18f8[uVar28];
            if ((uVar12 < 0xfffffff) &&
               (uVar14 = (ulong)(uVar12 >> 5) + local_1908 + 1,
               uVar14 <= (params->dist).max_distance)) {
              uVar12 = uVar12 & 0x1f;
              local_19d0->distance = (uint32_t)uVar14;
              if (uVar28 == uVar12) {
                uVar12 = 0;
              }
              local_19d0->length_and_code = uVar12 + iVar4;
              local_19d0 = local_19d0 + 1;
            }
            uVar28 = uVar28 + 1;
            iVar4 = iVar4 + 0x20;
          } while (uVar16 + 1 != uVar28);
        }
      }
      if ((long)local_19d0 - (long)matches == 0) {
        sVar18 = 0;
      }
      else {
        sVar18 = (long)local_19d0 - (long)matches >> 3;
        if (uVar11 < local_19d0[-1].length_and_code >> 5) {
          matches[0] = matches[sVar18 - 1];
          sVar18 = 1;
        }
      }
      sVar8 = UpdateNodes(num_bytes,position,pos,ringbuffer,ringbuffer_mask,params,
                          max_backward_limit,dist_cache,sVar18,matches,&local_b58,&queue,nodes);
      uVar14 = 0;
      if (0x3fff < sVar8) {
        uVar14 = sVar8;
      }
      if (sVar18 == 1) {
        uVar12 = matches[0].length_and_code >> 5;
        if ((uVar11 < uVar12) && (uVar14 < uVar12)) {
          uVar14 = (ulong)uVar12;
        }
      }
      sVar18 = pos;
      if (1 < uVar14) {
        uVar5 = uVar19 + 1;
        uVar6 = uVar14 + uVar19;
        if (lVar21 + position <= uVar14 + uVar19) {
          uVar6 = lVar21 + position;
        }
        uVar16 = uVar6 - 0x3f;
        if (uVar6 < uVar19 + 0x40) {
          uVar16 = uVar5;
        }
        if ((uVar19 + 0x201 <= uVar16) && (uVar5 < uVar16)) {
          uVar19 = (hasher->privat)._H5.bucket_size_;
          puVar1 = (hasher->privat)._H2.buckets_;
          pHVar2 = (hasher->privat)._H40.common;
          do {
            uVar29 = uVar5 & ringbuffer_mask;
            uVar12 = (uint)(*(int *)(ringbuffer + uVar29) * 0x1e35a7bd) >> 0xf;
            uVar28 = (ulong)puVar1[uVar12];
            local_19c0 = (uVar19 & uVar5) * 2 + 1;
            local_19c8 = (uVar19 & uVar5) * 2;
            puVar1[uVar12] = (uint32_t)uVar5;
            if (uVar5 != uVar28) {
              lVar26 = 0x40;
              uVar13 = 0;
              local_19d0 = (BackwardMatch *)0x0;
LAB_001130aa:
              bVar30 = lVar26 != 0;
              lVar26 = lVar26 + -1;
              if ((uVar5 - uVar28 <= uVar19 - 0xf) && (bVar30)) {
                pBVar9 = (BackwardMatch *)uVar13;
                if (local_19d0 < uVar13) {
                  pBVar9 = local_19d0;
                }
                puVar15 = ringbuffer + (long)pBVar9 + (uVar28 & ringbuffer_mask);
                uVar25 = 0x80 - (long)pBVar9;
                if (7 < uVar25) {
                  uVar22 = uVar25 & 0xfffffffffffffff8;
                  lVar24 = 0;
                  uVar17 = 0;
LAB_00113116:
                  if (*(ulong *)(puVar15 + uVar17 * 8) ==
                      *(ulong *)(ringbuffer + uVar17 * 8 + (long)pBVar9 + uVar29))
                  goto code_r0x00113123;
                  uVar22 = *(ulong *)(ringbuffer + uVar17 * 8 + (long)pBVar9 + uVar29) ^
                           *(ulong *)(puVar15 + uVar17 * 8);
                  uVar25 = 0;
                  if (uVar22 != 0) {
                    for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                    }
                  }
                  uVar17 = (uVar25 >> 3 & 0x1fffffff) - lVar24;
                  goto LAB_00113162;
                }
                uVar22 = 0;
                goto LAB_001131d0;
              }
            }
LAB_00113061:
            iVar4 = (hasher->privat)._H5.hash_shift_;
            *(int *)((long)&pHVar2->extra + local_19c8 * 4) = iVar4;
LAB_00113075:
            *(int *)((long)&pHVar2->extra + local_19c0 * 4) = iVar4;
            uVar5 = uVar5 + 8;
          } while (uVar5 < uVar16);
        }
        if (uVar16 < uVar6) {
          uVar19 = (hasher->privat)._H5.bucket_size_;
          puVar1 = (hasher->privat)._H2.buckets_;
          pHVar2 = (hasher->privat)._H40.common;
          do {
            uVar5 = uVar16 & ringbuffer_mask;
            uVar12 = (uint)(*(int *)(ringbuffer + uVar5) * 0x1e35a7bd) >> 0xf;
            uVar29 = (ulong)puVar1[uVar12];
            local_19c0 = (uVar19 & uVar16) * 2 + 1;
            local_19c8 = (uVar19 & uVar16) * 2;
            puVar1[uVar12] = (uint32_t)uVar16;
            if (uVar16 != uVar29) {
              lVar26 = 0x40;
              uVar28 = 0;
              local_19d0 = (BackwardMatch *)0x0;
LAB_001132df:
              bVar30 = lVar26 != 0;
              lVar26 = lVar26 + -1;
              if ((uVar16 - uVar29 <= uVar19 - 0xf) && (bVar30)) {
                pBVar9 = (BackwardMatch *)uVar28;
                if (local_19d0 < uVar28) {
                  pBVar9 = local_19d0;
                }
                puVar15 = ringbuffer + (long)pBVar9 + (uVar29 & ringbuffer_mask);
                uVar13 = 0x80 - (long)pBVar9;
                if (7 < uVar13) {
                  uVar22 = uVar13 & 0xfffffffffffffff8;
                  lVar24 = 0;
                  uVar25 = 0;
LAB_0011334b:
                  if (*(ulong *)(puVar15 + uVar25 * 8) ==
                      *(ulong *)(ringbuffer + uVar25 * 8 + (long)pBVar9 + uVar5))
                  goto code_r0x00113358;
                  uVar25 = *(ulong *)(ringbuffer + uVar25 * 8 + (long)pBVar9 + uVar5) ^
                           *(ulong *)(puVar15 + uVar25 * 8);
                  uVar13 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                    }
                  }
                  uVar25 = (uVar13 >> 3 & 0x1fffffff) - lVar24;
                  goto LAB_00113388;
                }
                uVar22 = 0;
                goto LAB_001133fc;
              }
            }
LAB_00113293:
            iVar4 = (hasher->privat)._H5.hash_shift_;
            *(int *)((long)&pHVar2->extra + local_19c8 * 4) = iVar4;
LAB_001132a7:
            *(int *)((long)&pHVar2->extra + local_19c0 * 4) = iVar4;
            uVar16 = uVar16 + 1;
          } while (uVar16 < uVar6);
        }
        lVar26 = uVar14 - 1;
        uVar19 = pos + 4;
        do {
          sVar18 = uVar19 - 3;
          if (num_bytes <= uVar19) break;
          EvaluateNode(local_1900,sVar18,max_backward_limit,(size_t)dist_cache,(int *)&local_b58,
                       (ZopfliCostModel *)&queue,(StartPosQueue *)nodes,nodes_00);
          uVar19 = uVar19 + 1;
          lVar26 = lVar26 + -1;
        } while (lVar26 != 0);
      }
      pos = sVar18 + 1;
    } while (sVar18 + 4 < num_bytes);
  }
  BrotliFree(m,local_b58.literal_costs_);
  BrotliFree(m,local_b58.cost_dist_);
  sVar10 = ComputeShortestPathFromNodes(num_bytes,nodes);
  return sVar10;
code_r0x001129c8:
  uVar22 = uVar22 + 1;
  lVar26 = lVar26 + -8;
  uVar17 = uVar16 & 0xfffffffffffffff8;
  puVar27 = puVar15 + (uVar16 & 0xfffffffffffffff8);
  if (uVar16 >> 3 == uVar22) goto LAB_00112a40;
  goto LAB_001129bb;
code_r0x00112e4d:
  uVar23 = uVar23 + 1;
  lVar24 = lVar24 + -8;
  if (uVar17 >> 3 == uVar23) goto code_r0x00112e59;
  goto LAB_00112e40;
code_r0x00112e59:
  puVar15 = puVar15 + -lVar24;
LAB_00112f5d:
  uVar17 = uVar17 & 7;
  uVar23 = uVar7;
  if (uVar17 != 0) {
    uVar20 = uVar7 | uVar17;
    do {
      uVar23 = uVar7;
      if (ringbuffer[uVar7 + uVar22 + uVar5] != *puVar15) break;
      puVar15 = puVar15 + 1;
      uVar7 = uVar7 + 1;
      uVar17 = uVar17 - 1;
      uVar23 = uVar20;
    } while (uVar17 != 0);
  }
LAB_00112e87:
  uVar23 = uVar23 + uVar22;
  if (local_19d0 == (BackwardMatch *)0x0) {
    local_19d0 = (BackwardMatch *)0x0;
  }
  else if (uVar28 < uVar23) {
    local_19d0->distance = (uint32_t)(uVar19 - uVar13);
    local_19d0->length_and_code = (int)uVar23 << 5;
    local_19d0 = local_19d0 + 1;
    uVar28 = uVar23;
  }
  if (uVar29 <= uVar23) {
    if (uVar16 < 0x80) goto LAB_00112b0e;
    *(undefined4 *)((long)&pHVar2->extra + local_1960 * 4) =
         *(undefined4 *)(&pHVar2->extra + (uVar13 & uVar6));
    iVar4 = *(int *)((long)&pHVar2->extra + (uVar13 & uVar6) * 8 + 4);
    goto LAB_00112b06;
  }
  if (ringbuffer[uVar23 + (uVar13 & ringbuffer_mask)] < ringbuffer[uVar23 + uVar5]) {
    if (0x7f < uVar16) {
      *(int *)((long)&pHVar2->extra + local_1960 * 4) = (int)uVar13;
    }
    lVar24 = (uVar13 & uVar6) * 2 + 1;
    uVar25 = uVar23;
    local_1960 = lVar24;
  }
  else {
    if (0x7f < uVar16) {
      *(int *)((long)&pHVar2->extra + local_1980 * 4) = (int)uVar13;
    }
    lVar24 = (uVar13 & uVar6) * 2;
    local_19a0 = uVar23;
    local_1980 = lVar24;
  }
  uVar13 = (ulong)*(uint *)((long)&pHVar2->extra + lVar24 * 4);
  if (uVar19 == uVar13) goto LAB_00112aea;
  goto LAB_00112dd5;
code_r0x00113123:
  uVar17 = uVar17 + 1;
  lVar24 = lVar24 + -8;
  if (uVar25 >> 3 == uVar17) goto code_r0x0011312f;
  goto LAB_00113116;
code_r0x0011312f:
  puVar15 = puVar15 + -lVar24;
LAB_001131d0:
  uVar25 = uVar25 & 7;
  uVar17 = uVar22;
  if (uVar25 != 0) {
    uVar23 = uVar22 | uVar25;
    do {
      uVar17 = uVar22;
      if (ringbuffer[uVar22 + (long)pBVar9 + uVar29] != *puVar15) break;
      puVar15 = puVar15 + 1;
      uVar22 = uVar22 + 1;
      uVar25 = uVar25 - 1;
      uVar17 = uVar23;
    } while (uVar25 != 0);
  }
LAB_00113162:
  uVar17 = uVar17 + (long)pBVar9;
  if (0x7f < uVar17) {
    *(undefined4 *)((long)&pHVar2->extra + local_19c8 * 4) =
         *(undefined4 *)(&pHVar2->extra + (uVar28 & uVar19));
    iVar4 = *(int *)((long)&pHVar2->extra + (uVar28 & uVar19) * 8 + 4);
    goto LAB_00113075;
  }
  uVar25 = (uVar28 & uVar19) * 2;
  if (ringbuffer[uVar17 + (uVar28 & ringbuffer_mask)] < ringbuffer[uVar17 + uVar29]) {
    *(int *)((long)&pHVar2->extra + local_19c8 * 4) = (int)uVar28;
    uVar25 = uVar25 | 1;
    local_19d0 = (BackwardMatch *)uVar17;
    local_19c8 = uVar25;
  }
  else {
    *(int *)((long)&pHVar2->extra + local_19c0 * 4) = (int)uVar28;
    uVar13 = uVar17;
    local_19c0 = uVar25;
  }
  uVar28 = (ulong)*(uint *)((long)&pHVar2->extra + uVar25 * 4);
  if (uVar5 == uVar28) goto LAB_00113061;
  goto LAB_001130aa;
code_r0x00113358:
  uVar25 = uVar25 + 1;
  lVar24 = lVar24 + -8;
  if (uVar13 >> 3 == uVar25) goto code_r0x00113364;
  goto LAB_0011334b;
code_r0x00113364:
  puVar15 = puVar15 + -lVar24;
LAB_001133fc:
  uVar13 = uVar13 & 7;
  uVar25 = uVar22;
  if (uVar13 != 0) {
    uVar17 = uVar22 | uVar13;
    do {
      uVar25 = uVar22;
      if (ringbuffer[uVar22 + (long)pBVar9 + uVar5] != *puVar15) break;
      puVar15 = puVar15 + 1;
      uVar22 = uVar22 + 1;
      uVar13 = uVar13 - 1;
      uVar25 = uVar17;
    } while (uVar13 != 0);
  }
LAB_00113388:
  uVar25 = uVar25 + (long)pBVar9;
  if (0x7f < uVar25) {
    *(undefined4 *)((long)&pHVar2->extra + local_19c8 * 4) =
         *(undefined4 *)(&pHVar2->extra + (uVar29 & uVar19));
    iVar4 = *(int *)((long)&pHVar2->extra + (uVar29 & uVar19) * 8 + 4);
    goto LAB_001132a7;
  }
  uVar13 = (uVar29 & uVar19) * 2;
  if (ringbuffer[uVar25 + (uVar29 & ringbuffer_mask)] < ringbuffer[uVar25 + uVar5]) {
    *(int *)((long)&pHVar2->extra + local_19c8 * 4) = (int)uVar29;
    uVar13 = uVar13 | 1;
    local_19d0 = (BackwardMatch *)uVar25;
    local_19c8 = uVar13;
  }
  else {
    *(int *)((long)&pHVar2->extra + local_19c0 * 4) = (int)uVar29;
    uVar28 = uVar25;
    local_19c0 = uVar13;
  }
  uVar29 = (ulong)*(uint *)((long)&pHVar2->extra + uVar13 * 4);
  if (uVar16 == uVar29) goto LAB_00113293;
  goto LAB_001132df;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m, size_t num_bytes,
    size_t position, const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    const int* dist_cache, Hasher* hasher, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[2 * (MAX_NUM_MATCHES_H10 + 64)];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  size_t gap = 0;
  size_t lz_matches_offset = 0;
  BROTLI_UNUSED(literal_context_lut);
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    const size_t dictionary_start = BROTLI_MIN(size_t,
        pos + stream_offset, max_backward_limit);
    size_t skip;
    size_t num_matches;
    num_matches = FindAllMatchesH10(&hasher->privat._H10,
        &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance,
        dictionary_start + gap, params, &matches[lz_matches_offset]);
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(&hasher->privat._H10,
          ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position + stream_offset, i, max_backward_limit, gap,
            dist_cache, &model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}